

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Block * __thiscall spv::Builder::makeNewBlock(Builder *this)

{
  Id id;
  Function *parent;
  Block *this_00;
  Block *block;
  Function *function;
  Builder *this_local;
  
  parent = Block::getParent(this->buildPoint);
  this_00 = (Block *)::operator_new(0x90);
  id = getUniqueId(this);
  Block::Block(this_00,id,parent);
  spv::Function::addBlock(parent,this_00);
  return this_00;
}

Assistant:

Block& Builder::makeNewBlock()
{
    Function& function = buildPoint->getParent();
    auto block = new Block(getUniqueId(), function);
    function.addBlock(block);
    return *block;
}